

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O3

Amount __thiscall cfd::FeeCalculator::GetFee(FeeCalculator *this,uint32_t size)

{
  ulong uVar1;
  ulong uVar2;
  Amount AVar3;
  
  uVar1 = (ulong)size * (ulong)this->baserate_;
  uVar2 = uVar1 * 0x1cac083126e978d5;
  uVar2 = (ulong)(0x4189374bc6a7ef < (uVar2 >> 3 | uVar2 << 0x3d)) + uVar1 / 1000;
  uVar1 = (ulong)((ulong)this->baserate_ != 0);
  if (uVar2 != 0) {
    uVar1 = uVar2;
  }
  if (size == 0) {
    uVar1 = uVar2;
  }
  AVar3 = core::Amount::CreateBySatoshiAmount(uVar1);
  return AVar3;
}

Assistant:

Amount FeeCalculator::GetFee(uint32_t size) const {
  int64_t byte_size = static_cast<int64_t>(size);
  int64_t temp_fee = baserate_ * byte_size;
  int64_t fee = temp_fee / 1000;

  // Round up
  if ((temp_fee % 1000) != 0) ++fee;

  if ((fee == 0) && (byte_size != 0) && (baserate_ != 0)) {
    fee = 1;
  }
  return Amount::CreateBySatoshiAmount(fee);
}